

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

iterator * __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::end
          (iterator *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          )

{
  vector<int,_std::allocator<int>_> local_48;
  int *local_30;
  int *piStack_28;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&(this->source).source);
  local_30 = (this->source).current._M_current;
  piStack_28 = (this->source).end._M_current;
  (__return_storage_ptr__->source).super_IState<int_&>._vptr_IState =
       (_func_int **)&PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector(&(__return_storage_ptr__->source).source,&local_48)
  ;
  (__return_storage_ptr__->source).current._M_current = local_30;
  (__return_storage_ptr__->source).end._M_current = piStack_28;
  __return_storage_ptr__->valid = false;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }